

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O2

_Bool Curl_altsvc_lookup(altsvcinfo *asi,alpnid srcalpnid,char *srchost,int srcport,
                        altsvc **dstentry,int versions)

{
  altsvc *as;
  Curl_llist_element *pCVar1;
  int iVar2;
  time_t tVar3;
  Curl_llist_element *e;
  
  tVar3 = time((time_t *)0x0);
  pCVar1 = (asi->list).head;
  do {
    do {
      while( true ) {
        e = pCVar1;
        if (e == (Curl_llist_element *)0x0) goto LAB_0010d224;
        as = (altsvc *)e->ptr;
        pCVar1 = e->next;
        if (tVar3 <= as->expires) break;
        Curl_llist_remove(&asi->list,e,(void *)0x0);
        altsvc_free(as);
      }
    } while ((as->src).alpnid != srcalpnid);
    iVar2 = Curl_strcasecompare((as->src).host,srchost);
  } while (((iVar2 == 0) || ((uint)(as->src).port != srcport)) ||
          (((as->dst).alpnid & versions) == ALPN_none));
  *dstentry = as;
LAB_0010d224:
  return e != (Curl_llist_element *)0x0;
}

Assistant:

bool Curl_altsvc_lookup(struct altsvcinfo *asi,
                        enum alpnid srcalpnid, const char *srchost,
                        int srcport,
                        struct altsvc **dstentry,
                        const int versions) /* one or more bits */
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *n;
  time_t now = time(NULL);
  DEBUGASSERT(asi);
  DEBUGASSERT(srchost);
  DEBUGASSERT(dstentry);

  for(e = asi->list.head; e; e = n) {
    struct altsvc *as = e->ptr;
    n = e->next;
    if(as->expires < now) {
      /* an expired entry, remove */
      Curl_llist_remove(&asi->list, e, NULL);
      altsvc_free(as);
      continue;
    }
    if((as->src.alpnid == srcalpnid) &&
       strcasecompare(as->src.host, srchost) &&
       (as->src.port == srcport) &&
       (versions & as->dst.alpnid)) {
      /* match */
      *dstentry = as;
      return TRUE;
    }
  }
  return FALSE;
}